

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrDumpVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  int iVar1;
  FILE *__stream;
  void *pvVar2;
  char *pcVar3;
  Vec_Ptr_t *vNtk_00;
  int local_2c;
  int i;
  Vec_Ptr_t *vNtk;
  FILE *pFile;
  Vec_Ptr_t *vDes_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    pvVar2 = Vec_PtrEntry(vDes,0);
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"// Design \"%s\" written via Ptr in ABC on %s\n\n",pvVar2,pcVar3);
    for (local_2c = 1; iVar1 = Vec_PtrSize(vDes), local_2c < iVar1; local_2c = local_2c + 1) {
      vNtk_00 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,local_2c);
      Bac_PtrDumpModuleVerilog((FILE *)__stream,vNtk_00);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Bac_PtrDumpVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    FILE * pFile;
    Vec_Ptr_t * vNtk; int i;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written via Ptr in ABC on %s\n\n", (char *)Vec_PtrEntry(vDes, 0), Extra_TimeStamp() );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Bac_PtrDumpModuleVerilog( pFile, vNtk );
    fclose( pFile );
}